

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O2

void __thiscall
Scalar::Scalar(Scalar *this,double d,string *unitPrefix,string *unitSymbol,string *name,string *type
              )

{
  allocator<char> local_d1;
  double local_d0;
  string local_c8;
  string local_a8;
  Unit local_88;
  
  local_d0 = d;
  StochasticFunction::StochasticFunction(&this->super_StochasticFunction,(Time *)0x0,name,type);
  (this->super_StochasticFunction).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__StochasticProcess_00156538;
  (this->super_StochasticFunction).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__Scalar_001565e8;
  (this->super_StochasticFunction).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__Scalar_00156630;
  this->scalarValue = local_d0;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
              physicalDescription);
  std::__cxx11::string::string((string *)&local_a8,(string *)unitPrefix);
  std::__cxx11::string::string((string *)&local_c8,(string *)unitSymbol);
  Unit::Unit(&local_88,&local_a8,&local_c8);
  Unit::operator=(&(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
                   physicalUnit,&local_88);
  Unit::~Unit(&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::assign
            ((char *)&(this->super_StochasticFunction).super_StochasticProcess.stochDescription);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"value",&local_d1);
  Parametric::addParameter((Parametric *)this,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

Scalar::Scalar(double d, string unitPrefix, string unitSymbol, const string& name, const string& type)
	: StochasticFunction(0, name, type)
{
	scalarValue = d;
	physicalDescription = name;
	physicalUnit = Unit(unitPrefix, unitSymbol);
	stochDescription = "scalar";
	addParameter("value");
}